

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_scroller.c
# Opt level: O1

void draw_background(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = al_get_bitmap_width(tile);
  iVar2 = al_get_bitmap_height(tile);
  for (; iVar4 = offy, 0 < offx; offx = offx - iVar1) {
  }
  for (; 0 < iVar4; iVar4 = iVar4 - iVar2) {
  }
  offy = iVar4;
  if (iVar4 < screen_height) {
    do {
      if (offx < screen_width) {
        iVar3 = offx;
        do {
          al_draw_bitmap((float)iVar3,(float)iVar4,tile,0);
          iVar3 = iVar3 + iVar1;
        } while (iVar3 < screen_width);
      }
      iVar4 = iVar4 + iVar2;
    } while (iVar4 < screen_height);
  }
  return;
}

Assistant:

void draw_background(void)
{
   int dx = al_get_bitmap_width(tile);
   int dy = al_get_bitmap_height(tile);
   int x, y;

   while (offx > 0)
      offx -= dx;
   while (offy > 0)
      offy -= dy;

   for (y = offy; y < screen_height; y += dy) {
      for (x = offx; x < screen_width; x += dx) {
         al_draw_bitmap(tile, x, y, 0);
      }
   }
}